

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPool.cpp
# Opt level: O0

VkResult __thiscall
myvk::QueryPool::GetResults64(QueryPool *this,uint64_t *data,VkQueryResultFlags flags)

{
  VkResult VVar1;
  uint32_t in_stack_00000018;
  uint32_t in_stack_0000001c;
  QueryPool *in_stack_00000020;
  
  VVar1 = GetResults64(in_stack_00000020,in_stack_0000001c,in_stack_00000018,(uint64_t *)this,
                       data._4_4_);
  return VVar1;
}

Assistant:

VkResult QueryPool::GetResults64(uint64_t *data, VkQueryResultFlags flags) const {
	return GetResults64(0, m_count, data, flags);
}